

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O3

void __thiscall
cmLocalGenerator::CopyPchCompilePdb
          (cmLocalGenerator *this,string *config,cmGeneratorTarget *target,string *ReuseFrom,
          cmGeneratorTarget *reuseTarget,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *extensions)

{
  pointer pcVar1;
  cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *pcVar2;
  char *__s;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer puVar4;
  cmTarget *this_00;
  _Alloc_hider _Var5;
  undefined8 uVar6;
  int iVar7;
  cmLocalGenerator *pcVar8;
  string *psVar9;
  ostream *poVar10;
  cmSourceFile *this_01;
  pointer pbVar11;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_02;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_03;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_04;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_05;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_06;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_07;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_08;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_09;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_10;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> ilist;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_11;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_12;
  string to_dir;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  outputs;
  string dest_file;
  __single_object cc;
  string pdb_prefix;
  string target_compile_pdb_dir;
  string copy_script;
  cmCustomCommandLines commandLines;
  cmGeneratedFileStream file;
  string local_4c0;
  string *local_4a0;
  string local_498;
  string local_478;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_458;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_448;
  size_type local_438;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_430;
  size_type local_428;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_420;
  undefined1 local_418 [16];
  cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> local_408;
  pointer local_3d8;
  pointer local_3d0;
  size_type local_3c8;
  pointer local_3c0;
  string local_3b8;
  __uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_> local_398;
  unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> local_390;
  string local_388;
  string local_368;
  string local_348;
  pointer local_328;
  cmGeneratorTarget *local_320;
  string local_318;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2e0;
  vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> local_2c8;
  vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> local_2b0;
  undefined1 local_298 [16];
  cmState *local_288;
  cmLinkedTree<cmStateDetail::SnapshotDataType> *local_280;
  size_type local_278;
  pointer local_270;
  undefined8 local_268;
  char *local_260;
  
  local_320 = reuseTarget;
  iVar7 = (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0x26])();
  if ((char)iVar7 == '\0') {
    local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_388,"");
  }
  else {
    local_298._8_8_ = (config->_M_dataplus)._M_p;
    local_298._0_8_ = config->_M_string_length;
    local_288 = (cmState *)0x1;
    local_280 = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)0x80020a;
    views._M_len = 2;
    views._M_array = (iterator)local_298;
    cmCatViews_abi_cxx11_(&local_388,views);
  }
  local_4a0 = config;
  pcVar8 = cmGeneratorTarget::GetLocalGenerator(target);
  cmStateSnapshot::GetDirectory
            ((cmStateDirectory *)local_298,&(pcVar8->super_cmOutputConverter).StateSnapshot);
  psVar9 = cmStateDirectory::GetCurrentBinary_abi_cxx11_((cmStateDirectory *)local_298);
  pcVar1 = (psVar9->_M_dataplus)._M_p;
  pcVar2 = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)psVar9->_M_string_length;
  psVar9 = cmGeneratorTarget::GetName_abi_cxx11_(target);
  local_288 = (cmState *)0x1;
  local_280 = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)0x80020a;
  local_270 = (psVar9->_M_dataplus)._M_p;
  local_278 = psVar9->_M_string_length;
  local_268 = 5;
  local_260 = ".dir/";
  views_00._M_len = 4;
  views_00._M_array = (iterator)local_298;
  local_298._0_8_ = pcVar2;
  local_298._8_8_ = pcVar1;
  cmCatViews_abi_cxx11_(&local_368,views_00);
  __s = (local_4a0->_M_dataplus)._M_p;
  local_298._0_8_ = local_368._M_string_length;
  local_298._8_8_ = local_368._M_dataplus._M_p;
  local_288 = (cmState *)0xd;
  local_280 = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)0x7c7d6b;
  local_278 = strlen(__s);
  local_268 = 6;
  local_260 = ".cmake";
  views_01._M_len = 4;
  views_01._M_array = (iterator)local_298;
  local_270 = __s;
  cmCatViews_abi_cxx11_(&local_318,views_01);
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_298,&local_318,false,None);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_298,"# CMake generated file\n",0x17);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_298,"# The compiler generated pdb file needs to be written to disk\n",
             0x3e);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_298,"# by mspdbsrv. The foreach retry loop is needed to make sure\n",
             0x3d);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_298,"# the pdb file is ready to be copied.\n\n",0x27);
  pbVar11 = (extensions->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_328 = (extensions->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar11 != local_328) {
    do {
      pcVar8 = cmGeneratorTarget::GetLocalGenerator(local_320);
      cmStateSnapshot::GetDirectory
                ((cmStateDirectory *)local_418,&(pcVar8->super_cmOutputConverter).StateSnapshot);
      psVar9 = cmStateDirectory::GetCurrentBinary_abi_cxx11_((cmStateDirectory *)local_418);
      local_418._8_8_ = (psVar9->_M_dataplus)._M_p;
      local_418._0_8_ = psVar9->_M_string_length;
      local_408.Data.
      super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x1;
      local_408.Data.
      super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)((long)"in Json::Value::setComment(): Comments must start with /" + 0x37);
      local_408.UpPositions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)(ReuseFrom->_M_dataplus)._M_p;
      local_408.Data.
      super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)ReuseFrom->_M_string_length;
      local_408.UpPositions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x12;
      local_408.UpPositions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x7c7e36;
      local_3c0 = (pbVar11->_M_dataplus)._M_p;
      local_3c8 = pbVar11->_M_string_length;
      views_02._M_len = 6;
      views_02._M_array = (iterator)local_418;
      local_3d8 = local_408.Data.
                  super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_3d0 = local_408.UpPositions.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start;
      cmCatViews_abi_cxx11_((string *)&local_458,views_02);
      pcVar8 = cmGeneratorTarget::GetLocalGenerator(target);
      cmStateSnapshot::GetDirectory
                ((cmStateDirectory *)local_418,&(pcVar8->super_cmOutputConverter).StateSnapshot);
      psVar9 = cmStateDirectory::GetCurrentBinary_abi_cxx11_((cmStateDirectory *)local_418);
      pcVar1 = (psVar9->_M_dataplus)._M_p;
      pcVar2 = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)
               psVar9->_M_string_length;
      psVar9 = cmGeneratorTarget::GetName_abi_cxx11_(target);
      local_408.Data.
      super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x1;
      local_408.Data.
      super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)((long)"in Json::Value::setComment(): Comments must start with /" + 0x37);
      local_408.UpPositions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)(psVar9->_M_dataplus)._M_p;
      local_408.Data.
      super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)psVar9->_M_string_length;
      local_408.UpPositions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x12;
      local_408.UpPositions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x7c7e36;
      views_03._M_len = 4;
      views_03._M_array = (iterator)local_418;
      local_418._0_8_ = pcVar2;
      local_418._8_8_ = pcVar1;
      cmCatViews_abi_cxx11_(&local_4c0,views_03);
      local_408.Data.
      super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)(ReuseFrom->_M_dataplus)._M_p;
      local_408.Data.
      super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)ReuseFrom->_M_string_length;
      local_418._0_8_ = local_4c0._M_string_length;
      local_418._8_8_ = local_4c0._M_dataplus._M_p;
      local_408.UpPositions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)(pbVar11->_M_dataplus)._M_p;
      local_408.Data.
      super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pbVar11->_M_string_length;
      views_04._M_len = 3;
      views_04._M_array = (iterator)local_418;
      cmCatViews_abi_cxx11_(&local_498,views_04);
      local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_478,local_498._M_dataplus._M_p,
                 local_498._M_dataplus._M_p + local_498._M_string_length);
      local_418._0_8_ = &local_408;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_418,"PREFIX","");
      psVar9 = cmGeneratorTarget::GetSafeProperty(target,(string *)local_418);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_418._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)&local_408) {
        operator_delete((void *)local_418._0_8_,
                        (ulong)((long)local_408.Data.
                                      super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
                                      ._M_impl.super__Vector_impl_data._M_start + 1));
      }
      if ((cmState *)psVar9->_M_string_length != (cmState *)0x0) {
        local_408.Data.
        super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)(psVar9->_M_dataplus)._M_p;
        local_418._0_8_ = local_4c0._M_string_length;
        local_418._8_8_ = local_4c0._M_dataplus._M_p;
        local_408.UpPositions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)(ReuseFrom->_M_dataplus)._M_p;
        local_408.Data.
        super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)ReuseFrom->_M_string_length;
        local_408.UpPositions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(pbVar11->_M_dataplus)._M_p;
        local_408.UpPositions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)pbVar11->_M_string_length;
        views_05._M_len = 4;
        views_05._M_array = (iterator)local_418;
        local_408.Data.
        super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)psVar9->_M_string_length;
        cmCatViews_abi_cxx11_(&local_3b8,views_05);
        std::__cxx11::string::operator=((string *)&local_478,(string *)&local_3b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
          operator_delete(local_3b8._M_dataplus._M_p,local_3b8.field_2._M_allocated_capacity + 1);
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_298,"foreach(retry RANGE 1 30)\n",0x1a);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_298,"  if (EXISTS \"",0xe)
      ;
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_298,(char *)local_458._M_allocated_capacity,
                           local_458._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\" AND (NOT EXISTS \"",0x13);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10,local_478._M_dataplus._M_p,local_478._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\" OR NOT \"",10);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10,local_478._M_dataplus._M_p,local_478._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"  \" IS_NEWER_THAN \"",0x13);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10,(char *)local_458._M_allocated_capacity,local_458._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\"))\n",4);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_298,"    execute_process(COMMAND ${CMAKE_COMMAND} -E copy",0x34);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_298," \"",2);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_298,(char *)local_458._M_allocated_capacity,
                           local_458._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\"",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," \"",2);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10,local_4c0._M_dataplus._M_p,local_4c0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\" RESULT_VARIABLE result ",0x19);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," ERROR_QUIET)\n",0xe);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_298,"    if (NOT result EQUAL 0)\n",0x1c);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_298,"      execute_process(COMMAND ${CMAKE_COMMAND}",0x2e);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_298," -E sleep 1)\n",0xd);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_298,"    else()\n",0xb);
      if (psVar9->_M_string_length != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_298,"  file(REMOVE \"",0xf);
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_298,local_478._M_dataplus._M_p,
                             local_478._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\")\n",3);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_298,"  file(RENAME \"",0xf);
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_298,local_498._M_dataplus._M_p,
                             local_498._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\" \"",3);
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar10,local_478._M_dataplus._M_p,local_478._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\")\n",3);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_298,"      break()\n",0xe)
      ;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_298,"    endif()\n",0xc);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_298,"  elseif(NOT EXISTS \"",0x15);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_298,(char *)local_458._M_allocated_capacity,
                           local_458._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\")\n",3);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar10,"    execute_process(COMMAND ${CMAKE_COMMAND}",0x2c);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," -E sleep 1)\n",0xd);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"  endif()\n",10);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_298,"endforeach()\n",0xd);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_478._M_dataplus._M_p != &local_478.field_2) {
        operator_delete(local_478._M_dataplus._M_p,local_478.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_498._M_dataplus._M_p != &local_498.field_2) {
        operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4c0._M_dataplus._M_p != &local_4c0.field_2) {
        operator_delete(local_4c0._M_dataplus._M_p,local_4c0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_458._M_allocated_capacity != &local_448) {
        operator_delete((void *)local_458._M_allocated_capacity,local_448._M_allocated_capacity + 1)
        ;
      }
      pbVar11 = pbVar11 + 1;
    } while (pbVar11 != local_328);
  }
  psVar9 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
  paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(psVar9->_M_dataplus)._M_p;
  puVar4 = (pointer)psVar9->_M_string_length;
  iVar7 = (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0x26])();
  if ((char)iVar7 == '\0') {
    local_4c0._M_dataplus._M_p = (pointer)&local_4c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_4c0,paVar3,paVar3->_M_local_buf + (long)puVar4);
  }
  else {
    local_408.Data.
    super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)(local_4a0->_M_dataplus)._M_p;
    local_408.Data.
    super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_4a0->_M_string_length;
    local_418._0_8_ = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)0xb;
    local_418._8_8_ = "$<$<CONFIG:";
    local_408.Data.
    super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x2;
    local_408.UpPositions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x7baa68;
    local_3d8 = (pointer)0x1;
    local_3d0 = (pointer)0x7e0e55;
    views_06._M_len = 5;
    views_06._M_array = (iterator)local_418;
    local_408.UpPositions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar4;
    local_408.UpPositions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)paVar3;
    cmCatViews_abi_cxx11_(&local_4c0,views_06);
  }
  local_458._M_allocated_capacity = local_4c0._M_string_length;
  local_458._8_8_ = local_4c0._M_dataplus._M_p;
  local_418._0_8_ = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)0xd;
  local_418._8_8_ = "-DPDB_PREFIX=";
  local_408.Data.
  super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_388._M_string_length;
  local_408.Data.
  super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_388._M_dataplus._M_p;
  views_07._M_len = 2;
  views_07._M_array = (iterator)local_418;
  cmCatViews_abi_cxx11_(&local_478,views_07);
  _Var5._M_p = local_478._M_dataplus._M_p;
  iVar7 = (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0x26])();
  if ((char)iVar7 == '\0') {
    local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_498,_Var5._M_p,_Var5._M_p + local_478._M_string_length);
  }
  else {
    local_408.Data.
    super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)(local_4a0->_M_dataplus)._M_p;
    local_408.Data.
    super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_4a0->_M_string_length;
    local_418._0_8_ = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)0xb;
    local_418._8_8_ = "$<$<CONFIG:";
    local_408.Data.
    super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x2;
    local_408.UpPositions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x7baa68;
    local_408.UpPositions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_478._M_string_length;
    local_408.UpPositions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)_Var5._M_p;
    local_3d8 = (pointer)0x1;
    local_3d0 = (pointer)0x7e0e55;
    views_08._M_len = 5;
    views_08._M_array = (iterator)local_418;
    cmCatViews_abi_cxx11_(&local_498,views_08);
  }
  local_448._M_allocated_capacity = local_498._M_string_length;
  local_448._8_8_ = local_498._M_dataplus._M_p;
  iVar7 = (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0x26])();
  if ((char)iVar7 == '\0') {
    local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b8,"-P","");
  }
  else {
    local_408.Data.
    super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)(local_4a0->_M_dataplus)._M_p;
    local_408.Data.
    super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_4a0->_M_string_length;
    local_418._0_8_ = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)0xb;
    local_418._8_8_ = "$<$<CONFIG:";
    local_408.Data.
    super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x2;
    local_408.UpPositions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x7baa68;
    local_408.UpPositions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x2;
    local_408.UpPositions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x790b3b;
    local_3d8 = (pointer)0x1;
    local_3d0 = (pointer)0x7e0e55;
    views_09._M_len = 5;
    views_09._M_array = (iterator)local_418;
    cmCatViews_abi_cxx11_(&local_3b8,views_09);
  }
  _Var5._M_p = local_318._M_dataplus._M_p;
  local_438 = local_3b8._M_string_length;
  local_430 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3b8._M_dataplus._M_p;
  iVar7 = (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0x26])();
  if ((char)iVar7 == '\0') {
    local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_348,_Var5._M_p,_Var5._M_p + local_318._M_string_length);
  }
  else {
    local_408.Data.
    super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)(local_4a0->_M_dataplus)._M_p;
    local_408.Data.
    super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_4a0->_M_string_length;
    local_418._0_8_ = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)0xb;
    local_418._8_8_ = "$<$<CONFIG:";
    local_408.Data.
    super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x2;
    local_408.UpPositions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x7baa68;
    local_408.UpPositions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_318._M_string_length;
    local_408.UpPositions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)_Var5._M_p;
    local_3d8 = (pointer)0x1;
    local_3d0 = (pointer)0x7e0e55;
    views_10._M_len = 5;
    views_10._M_array = (iterator)local_418;
    cmCatViews_abi_cxx11_(&local_348,views_10);
  }
  local_428 = local_348._M_string_length;
  local_420 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_348._M_dataplus._M_p;
  ilist._M_len = 4;
  ilist._M_array = (iterator)&local_458;
  cmMakeSingleCommandLine((cmCustomCommandLines *)&local_2b0,ilist);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._M_dataplus._M_p != &local_348.field_2) {
    operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
    operator_delete(local_3b8._M_dataplus._M_p,local_3b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_498._M_dataplus._M_p != &local_498.field_2) {
    operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_478._M_dataplus._M_p != &local_478.field_2) {
    operator_delete(local_478._M_dataplus._M_p,local_478.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0._M_dataplus._M_p != &local_4c0.field_2) {
    operator_delete(local_4c0._M_dataplus._M_p,local_4c0.field_2._M_allocated_capacity + 1);
  }
  local_498._M_dataplus._M_p = (pointer)0x0;
  local_498._M_string_length = 0;
  local_498.field_2._M_allocated_capacity = 0;
  local_418._0_8_ = local_368._M_string_length;
  local_418._8_8_ = local_368._M_dataplus._M_p;
  local_408.Data.
  super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_388._M_string_length;
  local_408.Data.
  super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_388._M_dataplus._M_p;
  local_408.UpPositions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)(ReuseFrom->_M_dataplus)._M_p;
  local_408.Data.
  super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)ReuseFrom->_M_string_length;
  local_408.UpPositions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x4;
  local_408.UpPositions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x7b7cf4;
  views_11._M_len = 4;
  views_11._M_array = (iterator)local_418;
  cmCatViews_abi_cxx11_(&local_4c0,views_11);
  _Var5._M_p = local_4c0._M_dataplus._M_p;
  iVar7 = (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0x26])();
  if ((char)iVar7 == '\0') {
    local_458._M_allocated_capacity = (size_type)&local_448;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_458,_Var5._M_p,_Var5._M_p + local_4c0._M_string_length);
  }
  else {
    local_408.Data.
    super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)(local_4a0->_M_dataplus)._M_p;
    local_408.Data.
    super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_4a0->_M_string_length;
    local_418._0_8_ = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)0xb;
    local_418._8_8_ = "$<$<CONFIG:";
    local_408.Data.
    super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x2;
    local_408.UpPositions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x7baa68;
    local_408.UpPositions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_4c0._M_string_length;
    local_408.UpPositions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)_Var5._M_p;
    local_3d8 = (pointer)0x1;
    local_3d0 = (pointer)0x7e0e55;
    views_12._M_len = 5;
    views_12._M_array = (iterator)local_418;
    cmCatViews_abi_cxx11_((string *)&local_458,views_12);
  }
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_498,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_458);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_458._M_allocated_capacity != &local_448) {
    operator_delete((void *)local_458._M_allocated_capacity,local_448._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0._M_dataplus._M_p != &local_4c0.field_2) {
    operator_delete(local_4c0._M_dataplus._M_p,local_4c0.field_2._M_allocated_capacity + 1);
  }
  std::make_unique<cmCustomCommand>();
  uVar6 = local_458._M_allocated_capacity;
  std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::vector
            (&local_2c8,&local_2b0);
  cmCustomCommand::SetCommandLines((cmCustomCommand *)uVar6,(cmCustomCommandLines *)&local_2c8);
  std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector(&local_2c8);
  cmCustomCommand::SetComment((cmCustomCommand *)local_458._M_allocated_capacity,"");
  cmCustomCommand::SetCMP0116Status((cmCustomCommand *)local_458._M_allocated_capacity,NEW);
  *(undefined1 *)(local_458._M_allocated_capacity + 0x12d) = 1;
  iVar7 = (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0x28])();
  uVar6 = local_458._M_allocated_capacity;
  if ((char)iVar7 == '\0') {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_2f8,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_498);
    cmCustomCommand::SetOutputs((cmCustomCommand *)uVar6,&local_2f8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_2f8);
    local_398._M_t.super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
    super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl =
         (tuple<cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>)
         (tuple<cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>)
         local_458._M_allocated_capacity;
    local_458._M_allocated_capacity = 0;
    this_01 = AddCustomCommandToOutput
                        (this,(unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)
                              &local_398,false);
    std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
              ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)&local_398);
    if (this_01 != (cmSourceFile *)0x0) {
      psVar9 = cmSourceFile::ResolveFullPath(this_01,(string *)0x0,(string *)0x0);
      cmGeneratorTarget::AddSource(target,psVar9,false);
    }
  }
  else {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_2e0,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_498);
    cmCustomCommand::SetByproducts((cmCustomCommand *)uVar6,&local_2e0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_2e0);
    psVar9 = cmGeneratorTarget::GetName_abi_cxx11_(target);
    local_390._M_t.super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>.
    _M_t.super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
    super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl =
         (__uniq_ptr_data<cmCustomCommand,_std::default_delete<cmCustomCommand>,_true,_true>)
         (__uniq_ptr_data<cmCustomCommand,_std::default_delete<cmCustomCommand>,_true,_true>)
         local_458._M_allocated_capacity;
    local_458._M_allocated_capacity = 0;
    AddCustomCommandToTarget(this,psVar9,PRE_BUILD,&local_390,Accept);
    std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr(&local_390)
    ;
  }
  this_00 = target->Target;
  local_418._0_8_ = &local_408;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_418,"COMPILE_PDB_OUTPUT_DIRECTORY","");
  cmTarget::SetProperty(this_00,(string *)local_418,&local_368);
  if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_418._0_8_ != &local_408) {
    operator_delete((void *)local_418._0_8_,
                    (ulong)((long)local_408.Data.
                                  super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 1));
  }
  std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
            ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)
             &local_458._M_allocated_capacity);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_498);
  std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector(&local_2b0);
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_298);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._M_dataplus._M_p != &local_318.field_2) {
    operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_dataplus._M_p != &local_368.field_2) {
    operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != &local_388.field_2) {
    operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmLocalGenerator::CopyPchCompilePdb(
  const std::string& config, cmGeneratorTarget* target,
  const std::string& ReuseFrom, cmGeneratorTarget* reuseTarget,
  const std::vector<std::string>& extensions)
{
  const std::string pdb_prefix =
    this->GetGlobalGenerator()->IsMultiConfig() ? cmStrCat(config, "/") : "";

  const std::string target_compile_pdb_dir =
    cmStrCat(target->GetLocalGenerator()->GetCurrentBinaryDirectory(), "/",
             target->GetName(), ".dir/");

  const std::string copy_script = cmStrCat(
    target_compile_pdb_dir, "copy_idb_pdb_", config.c_str(), ".cmake");
  cmGeneratedFileStream file(copy_script);

  file << "# CMake generated file\n";

  file << "# The compiler generated pdb file needs to be written to disk\n"
       << "# by mspdbsrv. The foreach retry loop is needed to make sure\n"
       << "# the pdb file is ready to be copied.\n\n";

  for (auto const& extension : extensions) {
    const std::string from_file =
      cmStrCat(reuseTarget->GetLocalGenerator()->GetCurrentBinaryDirectory(),
               "/", ReuseFrom, ".dir/${PDB_PREFIX}", ReuseFrom, extension);

    const std::string to_dir =
      cmStrCat(target->GetLocalGenerator()->GetCurrentBinaryDirectory(), "/",
               target->GetName(), ".dir/${PDB_PREFIX}");

    const std::string to_file = cmStrCat(to_dir, ReuseFrom, extension);

    std::string dest_file = to_file;

    std::string const& prefix = target->GetSafeProperty("PREFIX");
    if (!prefix.empty()) {
      dest_file = cmStrCat(to_dir, prefix, ReuseFrom, extension);
    }

    file << "foreach(retry RANGE 1 30)\n";
    file << "  if (EXISTS \"" << from_file << "\" AND (NOT EXISTS \""
         << dest_file << "\" OR NOT \"" << dest_file << "  \" IS_NEWER_THAN \""
         << from_file << "\"))\n";
    file << "    execute_process(COMMAND ${CMAKE_COMMAND} -E copy";
    file << " \"" << from_file << "\""
         << " \"" << to_dir << "\" RESULT_VARIABLE result "
         << " ERROR_QUIET)\n";
    file << "    if (NOT result EQUAL 0)\n"
         << "      execute_process(COMMAND ${CMAKE_COMMAND}"
         << " -E sleep 1)\n"
         << "    else()\n";
    if (!prefix.empty()) {
      file << "  file(REMOVE \"" << dest_file << "\")\n";
      file << "  file(RENAME \"" << to_file << "\" \"" << dest_file << "\")\n";
    }
    file << "      break()\n"
         << "    endif()\n";
    file << "  elseif(NOT EXISTS \"" << from_file << "\")\n"
         << "    execute_process(COMMAND ${CMAKE_COMMAND}"
         << " -E sleep 1)\n"
         << "  endif()\n";
    file << "endforeach()\n";
  }

  auto configGenex = [&](cm::string_view expr) -> std::string {
    if (this->GetGlobalGenerator()->IsMultiConfig()) {
      return cmStrCat("$<$<CONFIG:", config, ">:", expr, ">");
    }
    return std::string(expr);
  };

  cmCustomCommandLines commandLines = cmMakeSingleCommandLine(
    { configGenex(cmSystemTools::GetCMakeCommand()),
      configGenex(cmStrCat("-DPDB_PREFIX=", pdb_prefix)), configGenex("-P"),
      configGenex(copy_script) });

  const char* no_message = "";

  std::vector<std::string> outputs;
  outputs.push_back(configGenex(
    cmStrCat(target_compile_pdb_dir, pdb_prefix, ReuseFrom, ".pdb")));

  auto cc = cm::make_unique<cmCustomCommand>();
  cc->SetCommandLines(commandLines);
  cc->SetComment(no_message);
  cc->SetCMP0116Status(cmPolicies::NEW);
  cc->SetStdPipesUTF8(true);

  if (this->GetGlobalGenerator()->IsVisualStudio()) {
    cc->SetByproducts(outputs);
    this->AddCustomCommandToTarget(
      target->GetName(), cmCustomCommandType::PRE_BUILD, std::move(cc),
      cmObjectLibraryCommands::Accept);
  } else {
    cc->SetOutputs(outputs);
    cmSourceFile* copy_rule = this->AddCustomCommandToOutput(std::move(cc));

    if (copy_rule) {
      target->AddSource(copy_rule->ResolveFullPath());
    }
  }

  target->Target->SetProperty("COMPILE_PDB_OUTPUT_DIRECTORY",
                              target_compile_pdb_dir);
}